

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Base>
          (Structure *this,Base *dest,FileDatabase *db)

{
  element_type *peVar1;
  StreamReader<true,_true> *pSVar2;
  Base *pBVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  int local_38;
  
  peVar1 = (db->reader).
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = (long)peVar1->current - (long)peVar1->buffer;
  uVar7 = uVar6 & 0xffffffff;
  do {
    pSVar2 = (db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    StreamReader<true,_true>::SetPtr(pSVar2,pSVar2->buffer + (int)uVar7);
    dest->prev = (Base *)0x0;
    bVar4 = false;
    ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->object,"*object",db,false);
    bVar5 = ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Base>(this,&dest->next,"*next",db,true);
    if (!bVar5) {
      pBVar3 = (dest->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pBVar3 == (Base *)0x0) {
        bVar4 = false;
      }
      else {
        peVar1 = (db->reader).
                 super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar7 = (ulong)(uint)(*(int *)&peVar1->current - *(int *)&peVar1->buffer);
        bVar4 = true;
        dest = pBVar3;
      }
    }
  } while (bVar4);
  pSVar2 = (db->reader).
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (int)uVar6;
  StreamReader<true,_true>::SetPtr(pSVar2,pSVar2->buffer + (long)local_38 + this->size);
  return;
}

Assistant:

void Structure :: Convert<Base> (
    Base& dest,
    const FileDatabase& db
    ) const
{
    // note: as per https://github.com/assimp/assimp/issues/128,
    // reading the Object linked list recursively is prone to stack overflow.
    // This structure converter is therefore an hand-written exception that
    // does it iteratively.

    const int initial_pos = db.reader->GetCurrentPos();

    std::pair<Base*, int> todo = std::make_pair(&dest, initial_pos);
    for ( ;; ) {

        Base& cur_dest = *todo.first;
        db.reader->SetCurrentPos(todo.second);

        // we know that this is a double-linked, circular list which we never
        // traverse backwards, so don't bother resolving the back links.
        cur_dest.prev = NULL;

        ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.object,"*object",db);

        // the return value of ReadFieldPtr indicates whether the object
        // was already cached. In this case, we don't need to resolve
        // it again.
        if(!ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.next,"*next",db, true) && cur_dest.next) {
            todo = std::make_pair(&*cur_dest.next, db.reader->GetCurrentPos());
            continue;
        }
        break;
    }

    db.reader->SetCurrentPos(initial_pos + size);
}